

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O0

int stb_perfect_create(stb_perfect *p,uint *v,int n)

{
  ushort uVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  void *p_00;
  void *p_01;
  void *p_02;
  void *pvVar6;
  void *p_03;
  unsigned_long uVar7;
  stb_uint32 *psVar8;
  short *psVar9;
  stb_uint16 *psVar10;
  _func_int_void_ptr_void_ptr *__compar;
  ushort *puVar11;
  uint *data;
  int a_1;
  int a;
  int w;
  int b;
  int bad;
  unsigned_short *e;
  unsigned_short *bloc;
  stb__slot *bcount;
  int k;
  int j;
  int i;
  int failure;
  int bsize;
  int size;
  unsigned_short *entries;
  unsigned_short *bs;
  unsigned_short *as;
  uint buffer5 [32];
  uint buffer4 [64];
  uint buffer3 [64];
  uint buffer2 [64];
  uint buffer1 [64];
  int n_local;
  uint *v_local;
  stb_perfect *p_local;
  
  p_00 = stb__temp(buffer2 + 0x3e,0x100,n << 2);
  p_01 = stb__temp(buffer3 + 0x3e,0x100,n << 2);
  p_02 = stb__temp(buffer5 + 0x1e,0x100,n << 1);
  iVar4 = stb_log2_ceil(n);
  failure = 1 << ((byte)iVar4 & 0x1f);
  i = 8;
  j = 0;
  if (0x8000 < n) {
    __assert_fail("n <= 32768",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                  ,0xde7,"int stb_perfect_create(stb_perfect *, unsigned int *, int)");
  }
  p->large_bmap = (stb_uint16 *)0x0;
LAB_001c2cbc:
  do {
    pvVar6 = stb__temp(buffer4 + 0x3e,0x100,i << 4);
    p_03 = stb__temp(&as,0x80,i << 1);
    bVar3 = false;
    uVar7 = stb__perfect_rand();
    p->addend = (stb_uint32)uVar7;
    uVar7 = stb__perfect_rand();
    p->multiplicand = (uint)uVar7 | 1;
    p->table_mask = failure - 1;
    p->b_mask = i - 1;
    psVar8 = (stb_uint32 *)malloc((long)failure << 2);
    p->table = psVar8;
    for (k = 0; k < i; k = k + 1) {
      *(short *)((long)pvVar6 + (long)k * 0x10 + 2) = (short)k;
      *(undefined2 *)((long)pvVar6 + (long)k * 0x10) = 0;
      *(undefined2 *)((long)pvVar6 + (long)k * 0x10 + 4) = 0;
    }
    for (k = 0; k < n; k = k + 1) {
      stb__perfect_prehash
                (p,v[k],(stb_uint16 *)((long)p_00 + (long)k * 2),
                 (stb_uint16 *)((long)p_01 + (long)k * 2));
      psVar9 = (short *)((long)pvVar6 + (ulong)*(ushort *)((long)p_01 + (long)k * 2) * 0x10);
      *psVar9 = *psVar9 + 1;
    }
    qsort(pvVar6,(long)i,0x10,stb__slot_compare);
    _b = p_02;
    for (k = 0; k < i; k = k + 1) {
      *(void **)((long)pvVar6 + (long)k * 0x10 + 8) = _b;
      _b = (void *)((long)_b + (long)(int)(uint)*(ushort *)((long)pvVar6 + (long)k * 0x10) * 2);
      *(undefined2 *)((long)pvVar6 + (long)k * 0x10) = 0;
      *(short *)((long)p_03 + (ulong)*(ushort *)((long)pvVar6 + (long)k * 0x10 + 2) * 2) = (short)k;
    }
    for (k = 0; k < n; k = k + 1) {
      uVar5 = (uint)*(ushort *)
                     ((long)p_03 + (long)(int)(uint)*(ushort *)((long)p_01 + (long)k * 2) * 2);
      lVar2 = *(long *)((long)pvVar6 + (long)(int)uVar5 * 0x10 + 8);
      puVar11 = (ushort *)((long)pvVar6 + (long)(int)uVar5 * 0x10);
      uVar1 = *puVar11;
      *puVar11 = uVar1 + 1;
      *(short *)(lVar2 + (ulong)uVar1 * 2) = (short)k;
    }
    stb_tempfree(&as,p_03);
    for (k = 0; k < i; k = k + 1) {
      for (bcount._4_4_ = 0;
          (int)bcount._4_4_ < (int)(uint)*(ushort *)((long)pvVar6 + (long)k * 0x10);
          bcount._4_4_ = bcount._4_4_ + 1) {
        if (*(short *)((long)p_01 +
                      (ulong)*(ushort *)
                              (*(long *)((long)pvVar6 + (long)k * 0x10 + 8) +
                              (long)(int)bcount._4_4_ * 2) * 2) !=
            *(short *)((long)pvVar6 + (long)k * 0x10 + 2)) {
          __assert_fail("bs[bcount[i].entries[j]] == bcount[i].b",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                        ,0xe11,"int stb_perfect_create(stb_perfect *, unsigned int *, int)");
        }
      }
    }
    memset(p->table,0,(long)failure << 2);
    for (k = 0; k < i; k = k + 1) {
      if (1 < *(ushort *)((long)pvVar6 + (long)k * 0x10)) {
        for (bcount._4_4_ = 0;
            (int)bcount._4_4_ < (int)(uint)*(ushort *)((long)pvVar6 + (long)k * 0x10);
            bcount._4_4_ = bcount._4_4_ + 1) {
          if (p->table[*(ushort *)
                        ((long)p_00 +
                        (ulong)*(ushort *)
                                (*(long *)((long)pvVar6 + (long)k * 0x10 + 8) +
                                (long)(int)bcount._4_4_ * 2) * 2)] != 0) {
            bVar3 = true;
          }
          p->table[*(ushort *)
                    ((long)p_00 +
                    (ulong)*(ushort *)
                            (*(long *)((long)pvVar6 + (long)k * 0x10 + 8) +
                            (long)(int)bcount._4_4_ * 2) * 2)] = 1;
        }
        for (bcount._4_4_ = 0;
            (int)bcount._4_4_ < (int)(uint)*(ushort *)((long)pvVar6 + (long)k * 0x10);
            bcount._4_4_ = bcount._4_4_ + 1) {
          p->table[*(ushort *)
                    ((long)p_00 +
                    (ulong)*(ushort *)
                            (*(long *)((long)pvVar6 + (long)k * 0x10 + 8) +
                            (long)(int)bcount._4_4_ * 2) * 2)] = 0;
        }
        if (bVar3) break;
      }
    }
    if (!bVar3) {
      for (k = 0; k < i; k = k + 1) {
        if (*(short *)((long)pvVar6 + (long)k * 0x10) != 0) {
          bcount._4_4_ = 0;
LAB_001c331e:
          if ((int)bcount._4_4_ < failure) {
            bcount._0_4_ = 0;
            while (((int)(uint)bcount < (int)(uint)*(ushort *)((long)pvVar6 + (long)k * 0x10) &&
                   (p->table[(*(ushort *)
                               ((long)p_00 +
                               (ulong)*(ushort *)
                                       (*(long *)((long)pvVar6 + (long)k * 0x10 + 8) +
                                       (long)(int)(uint)bcount * 2) * 2) ^ bcount._4_4_) &
                             p->table_mask] == 0))) {
              bcount._0_4_ = (uint)bcount + 1;
            }
            if ((uint)bcount != *(ushort *)((long)pvVar6 + (long)k * 0x10)) goto LAB_001c34b1;
            *(short *)((long)pvVar6 + (long)k * 0x10 + 4) = (short)bcount._4_4_;
            for (bcount._0_4_ = 0;
                (int)(uint)bcount < (int)(uint)*(ushort *)((long)pvVar6 + (long)k * 0x10);
                bcount._0_4_ = (uint)bcount + 1) {
              p->table[(*(ushort *)
                         ((long)p_00 +
                         (ulong)*(ushort *)
                                 (*(long *)((long)pvVar6 + (long)k * 0x10 + 8) +
                                 (long)(int)(uint)bcount * 2) * 2) ^ bcount._4_4_) & p->table_mask]
                   = 1;
            }
          }
          if (bcount._4_4_ != failure) goto LAB_001c34d7;
          break;
        }
LAB_001c34d7:
      }
      if (k == i) {
        if ((i < 0x11) && (failure < 0x101)) {
          p->large_bmap = (stb_uint16 *)0x0;
          for (k = 0; k < i; k = k + 1) {
            p->small_bmap[*(ushort *)((long)pvVar6 + (long)k * 0x10 + 2)] =
                 (stb_uint8)*(undefined2 *)((long)pvVar6 + (long)k * 0x10 + 4);
          }
        }
        else {
          psVar10 = (stb_uint16 *)malloc((long)i << 1);
          p->large_bmap = psVar10;
          for (k = 0; k < i; k = k + 1) {
            p->large_bmap[*(ushort *)((long)pvVar6 + (long)k * 0x10 + 2)] =
                 *(stb_uint16 *)((long)pvVar6 + (long)k * 0x10 + 4);
          }
        }
        for (k = 0; k < failure; k = k + 1) {
          p->table[k] = *v;
        }
        for (k = 0; k < n; k = k + 1) {
          if (p->large_bmap == (stb_uint16 *)0x0) {
            p->table[(int)((uint)*(ushort *)((long)p_00 + (long)k * 2) ^
                          (uint)p->small_bmap[*(ushort *)((long)p_01 + (long)k * 2)])] = v[k];
          }
          else {
            p->table[(int)(uint)(*(ushort *)((long)p_00 + (long)k * 2) ^
                                p->large_bmap[*(ushort *)((long)p_01 + (long)k * 2)])] = v[k];
          }
        }
        for (k = 0; k < n; k = k + 1) {
          iVar4 = stb_perfect_hash(p,v[k]);
          if (iVar4 < 0) {
            __assert_fail("stb_perfect_hash(p, v[i]) >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                          ,0xe56,"int stb_perfect_create(stb_perfect *, unsigned int *, int)");
          }
        }
        stb_tempfree(buffer4 + 0x3e,pvVar6);
LAB_001c394d:
        if (stb_perfect_hash_max_failures < j) {
          stb_perfect_hash_max_failures = j;
        }
        stb_tempfree(buffer2 + 0x3e,p_00);
        stb_tempfree(buffer3 + 0x3e,p_01);
        stb_tempfree(buffer5 + 0x1e,p_02);
        return failure;
      }
    }
    free(p->table);
    p->table = (stb_uint32 *)0x0;
    stb_tempfree(buffer4 + 0x3e,pvVar6);
    j = j + 1;
    if ((3 < j) && (i < failure)) {
      i = i << 1;
    }
    if (((7 < j) && ((j & 3U) == 0)) && (failure < n * 4)) {
      failure = failure << 1;
      i = i << 1;
    }
    if (j != 6) goto LAB_001c2cbc;
    pvVar6 = stb__temp(buffer4 + 0x3e,0x100,n << 2);
    memcpy(pvVar6,v,(long)n << 2);
    __compar = stb_intcmp(0);
    qsort(pvVar6,(long)n,4,(__compar_fn_t)__compar);
    for (k = 1; k < n; k = k + 1) {
      if (*(int *)((long)pvVar6 + (long)k * 4) == *(int *)((long)pvVar6 + (long)(k + -1) * 4)) {
        failure = 0;
      }
    }
    stb_tempfree(buffer4 + 0x3e,pvVar6);
    if (failure == 0) goto LAB_001c394d;
  } while( true );
LAB_001c34b1:
  bcount._4_4_ = bcount._4_4_ + 1;
  goto LAB_001c331e;
}

Assistant:

int stb_perfect_create(stb_perfect *p, unsigned int *v, int n)
{
   unsigned int buffer1[64], buffer2[64], buffer3[64], buffer4[64], buffer5[32];
   unsigned short *as = (unsigned short *) stb_temp(buffer1, sizeof(*v)*n);
   unsigned short *bs = (unsigned short *) stb_temp(buffer2, sizeof(*v)*n);
   unsigned short *entries = (unsigned short *) stb_temp(buffer4, sizeof(*entries) * n);
   int size = 1 << stb_log2_ceil(n), bsize=8;
   int failure = 0,i,j,k;

   assert(n <= 32768);
   p->large_bmap = NULL;

   for(;;) {
      stb__slot *bcount = (stb__slot *) stb_temp(buffer3, sizeof(*bcount) * bsize);
      unsigned short *bloc = (unsigned short *) stb_temp(buffer5, sizeof(*bloc) * bsize);
      unsigned short *e;
      int bad=0;

      p->addend = stb__perfect_rand();
      p->multiplicand = stb__perfect_rand() | 1;
      p->table_mask = size-1;
      p->b_mask = bsize-1;
      p->table = (stb_uint32 *) malloc(size * sizeof(*p->table));

      for (i=0; i < bsize; ++i) {
         bcount[i].b     = i;
         bcount[i].count = 0;
         bcount[i].map   = 0;
      }
      for (i=0; i < n; ++i) {
         stb__perfect_prehash(p, v[i], as+i, bs+i);
         ++bcount[bs[i]].count;
      }
      qsort(bcount, bsize, sizeof(*bcount), stb__slot_compare);
      e = entries; // now setup up their entries index
      for (i=0; i < bsize; ++i) {
         bcount[i].entries = e;
         e += bcount[i].count;
         bcount[i].count = 0;
         bloc[bcount[i].b] = i;
      }
      // now fill them out
      for (i=0; i < n; ++i) {
         int b = bs[i];
         int w = bloc[b];
         bcount[w].entries[bcount[w].count++] = i;
      }
      stb_tempfree(buffer5,bloc);
      // verify
      for (i=0; i < bsize; ++i)
         for (j=0; j < bcount[i].count; ++j)
            assert(bs[bcount[i].entries[j]] == bcount[i].b);
      memset(p->table, 0, size*sizeof(*p->table));

      // check if any b has duplicate a
      for (i=0; i < bsize; ++i) {
         if (bcount[i].count > 1) {
            for (j=0; j < bcount[i].count; ++j) {
               if (p->table[as[bcount[i].entries[j]]])
                  bad = 1;
               p->table[as[bcount[i].entries[j]]] = 1;
            }
            for (j=0; j < bcount[i].count; ++j) {
               p->table[as[bcount[i].entries[j]]] = 0;
            }
            if (bad) break;
         }
      }

      if (!bad) {
         // go through the bs and populate the table, first fit
         for (i=0; i < bsize; ++i) {
            if (bcount[i].count) {
               // go through the candidate table[b] values
               for (j=0; j < size; ++j) {
                  // go through the a values and see if they fit
                  for (k=0; k < bcount[i].count; ++k) {
                     int a = as[bcount[i].entries[k]];
                     if (p->table[(a^j)&p->table_mask]) {
                        break; // fails
                     }
                  }
                  // if succeeded, accept
                  if (k == bcount[i].count) {
                     bcount[i].map = j;
                     for (k=0; k < bcount[i].count; ++k) {
                        int a = as[bcount[i].entries[k]];
                        p->table[(a^j)&p->table_mask] = 1;
                     }
                     break;
                  }
               }
               if (j == size)
                  break; // no match for i'th entry, so break out in failure
            }
         }
         if (i == bsize) {
            // success... fill out map
            if (bsize <= 16 && size <= 256) {
               p->large_bmap = NULL;
               for (i=0; i < bsize; ++i)
                  p->small_bmap[bcount[i].b] = (stb_uint8) bcount[i].map;
            } else {
               p->large_bmap = (unsigned short *) malloc(sizeof(*p->large_bmap) * bsize);
               for (i=0; i < bsize; ++i)
                  p->large_bmap[bcount[i].b] = bcount[i].map;
            }

            // initialize table to v[0], so empty slots will fail
            for (i=0; i < size; ++i)
               p->table[i] = v[0];

            for (i=0; i < n; ++i)
               if (p->large_bmap)
                  p->table[as[i] ^ p->large_bmap[bs[i]]] = v[i];
               else
                  p->table[as[i] ^ p->small_bmap[bs[i]]] = v[i];

            // and now validate that none of them collided
            for (i=0; i < n; ++i)
               assert(stb_perfect_hash(p, v[i]) >= 0);

            stb_tempfree(buffer3, bcount);
            break;
         }
      }
      free(p->table);
      p->table = NULL;
      stb_tempfree(buffer3, bcount);

      ++failure;
      if (failure >= 4 && bsize < size) bsize *= 2;
      if (failure >= 8 && (failure & 3) == 0 && size < 4*n) {
         size *= 2;
         bsize *= 2;
      }
      if (failure == 6) {
         // make sure the input data is unique, so we don't infinite loop
         unsigned int *data = (unsigned int *) stb_temp(buffer3, n * sizeof(*data));
         memcpy(data, v, sizeof(*data) * n);
         qsort(data, n, sizeof(*data), stb_intcmp(0));
         for (i=1; i < n; ++i) {
            if (data[i] == data[i-1])
               size = 0; // size is return value, so 0 it
         }
         stb_tempfree(buffer3, data);
         if (!size) break;
      }
   }

   if (failure > stb_perfect_hash_max_failures)
      stb_perfect_hash_max_failures = failure;

   stb_tempfree(buffer1, as);
   stb_tempfree(buffer2, bs);
   stb_tempfree(buffer4, entries);

   return size;
}